

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

bool __thiscall Jinx::Impl::Runtime::PropertyExists(Runtime *this,RuntimeID id)

{
  const_iterator cVar1;
  RuntimeID local_28;
  
  local_28 = id;
  std::mutex::lock(&this->m_propertyMutex);
  cVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Jinx::Variant>,_std::_Select1st<std::pair<const_unsigned_long,_Jinx::Variant>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
          ::find(&(this->m_propertyMap)._M_t,&local_28);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->m_propertyMap)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

inline_t bool Runtime::PropertyExists(RuntimeID id) const
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		return m_propertyMap.find(id) != m_propertyMap.end();
	}